

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::piece_picker::is_requested(piece_picker *this,piece_block block)

{
  bool bVar1;
  value_type *this_00;
  reference dp;
  block_info *pbVar2;
  undefined1 local_48 [8];
  span<const_libtorrent::aux::piece_picker::block_info> info;
  __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_30;
  const_iterator i;
  download_queue_t state;
  piece_picker *this_local;
  int iStack_10;
  piece_block block_local;
  
  this_local._4_4_ = (int)block.piece_index.m_val;
  i._M_current._0_4_ = this_local._4_4_;
  this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,this_local._4_4_);
  i._M_current._7_1_ = piece_pos::download_queue(this_00);
  bVar1 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator==
                    ((strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void> *)
                     ((long)&i._M_current + 7),&piece_pos::piece_open);
  if (bVar1) {
    block_local.piece_index.m_val._3_1_ = false;
  }
  else {
    info.m_len._7_1_ = i._M_current._7_1_;
    info.m_len._0_4_ = this_local._4_4_;
    local_30._M_current =
         (downloading_piece *)find_dl_piece(this,i._M_current._7_1_,(piece_index_t)this_local._4_4_)
    ;
    dp = __gnu_cxx::
         __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
         ::operator*(&local_30);
    _local_48 = blocks_for_piece(this,dp);
    iStack_10 = block.block_index;
    pbVar2 = span<const_libtorrent::aux::piece_picker::block_info>::operator[]
                       ((span<const_libtorrent::aux::piece_picker::block_info> *)local_48,
                        (long)iStack_10);
    block_local.piece_index.m_val._3_1_ = *(ushort *)&pbVar2->field_0x8 >> 0xe == 1;
  }
  return block_local.piece_index.m_val._3_1_;
}

Assistant:

bool piece_picker::is_requested(piece_block const block) const
	{
		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);
		TORRENT_ASSERT(block.piece_index < m_piece_map.end_index());

		auto const state = m_piece_map[block.piece_index].download_queue();
		if (state == piece_pos::piece_open) return false;
		auto const i = find_dl_piece(state, block.piece_index);

		TORRENT_ASSERT(i != m_downloads[state].end());

		auto const info = blocks_for_piece(*i);
		TORRENT_ASSERT(info[block.block_index].piece_index == block.piece_index);
		return info[block.block_index].state == block_info::state_requested;
	}